

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::traversal_algorithm::add_entry
          (traversal_algorithm *this,node_id *id,endpoint *addr,observer_flags_t flags)

{
  byte bVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  dht_observer *pdVar4;
  session_settings *psVar5;
  pointer psVar6;
  element_type *peVar7;
  undefined8 uVar8;
  _WordT _Var9;
  uint64_t uVar10;
  aux *this_00;
  aux *this_01;
  bool bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  undefined4 extraout_var;
  long lVar15;
  undefined4 extraout_var_00;
  pointer psVar16;
  undefined4 extraout_var_01;
  node_id *pnVar17;
  ulong uVar18;
  char cVar19;
  node_id *n2;
  node_id *n2_00;
  address *addr_00;
  char cVar20;
  const_iterator __position;
  difference_type __d;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar24;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar25;
  span<const_char> in;
  span<const_char> in_00;
  span<const_char> in_01;
  uint64_t prefix6;
  undefined1 local_c0 [24];
  traversal_algorithm *local_a8;
  observer_ptr o;
  uint32_t prefix4;
  undefined4 uStack_8c;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  ulong local_70;
  pointer local_68;
  aux *local_60;
  aux *local_58;
  bytes_type addr_bytes;
  endpoint *ep;
  endpoint *ep_00;
  
  if (this->m_done != false) {
    return;
  }
  pnVar17 = id;
  (*this->_vptr_traversal_algorithm[5])(&o,this);
  if (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pdVar4 = this->m_node->m_observer;
    if (pdVar4 != (dht_observer *)0x0) {
      (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
                (pdVar4,4,"[%u] failed to allocate memory or observer. aborting!",(ulong)this->m_id)
      ;
    }
    (*this->_vptr_traversal_algorithm[4])(this);
    goto LAB_003d9641;
  }
  ((o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->flags).
  m_val = ((o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          flags).m_val | flags.m_val;
  bVar11 = digest32<160L>::is_all_zeros(id);
  peVar7 = o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (bVar11) {
    generate_random_id();
    observer::set_id(peVar7,(node_id *)&prefix6);
    ((o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->flags).
    m_val = ((o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            flags).m_val | 4;
    ::std::
    vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
    ::push_back(&this->m_results,&o);
    pdVar4 = this->m_node->m_observer;
    if ((pdVar4 != (dht_observer *)0x0) &&
       (iVar12 = (**(pdVar4->super_dht_logger)._vptr_dht_logger)(pdVar4,4), (char)iVar12 != '\0')) {
      uVar14 = this->m_id;
      in.m_len = (difference_type)pnVar17;
      in.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_((string *)&prefix6,(aux *)id,in);
      local_a8 = (traversal_algorithm *)prefix6;
      aux::print_endpoint_abi_cxx11_((string *)&prefix4,(aux *)addr,ep);
      uVar8 = CONCAT44(uStack_8c,prefix4);
      uVar13 = distance_exp((dht *)&this->m_target,id,n2);
      cVar19 = this->m_invoke_count;
      iVar12 = (*this->_vptr_traversal_algorithm[2])(this);
      (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
                (pdVar4,4,"[%u] ADD (no-id) id: %s addr: %s distance: %d invoke-count: %d type: %s",
                 (ulong)uVar14,local_a8,uVar8,(ulong)uVar13,(ulong)(uint)(int)cVar19,
                 CONCAT44(extraout_var,iVar12));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_8c,prefix4) != &local_80) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_8c,prefix4),local_80._M_allocated_capacity + 1);
      }
      if ((undefined1 *)prefix6 != local_c0 + 8) {
        operator_delete((void *)prefix6,local_c0._8_8_ + 1);
      }
    }
  }
  else {
    __position._M_current =
         (this->m_results).
         super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_70 = (ulong)this->m_sorted_results;
    local_a8 = this;
    local_68 = __position._M_current;
    local_60 = (aux *)addr;
    local_58 = (aux *)id;
    if (0 < (long)local_70) {
      uVar18 = local_70;
      do {
        uVar21 = uVar18 >> 1;
        bVar11 = compare_ref(&(__position._M_current[uVar21].
                               super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_id,
                             &(o.
                               super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_id,&this->m_target);
        if (bVar11) {
          __position._M_current = __position._M_current + uVar21 + 1;
          uVar21 = ~uVar21 + uVar18;
        }
        uVar18 = uVar21;
      } while (0 < (long)uVar21);
    }
    this_01 = local_58;
    this_00 = local_60;
    uVar18 = local_70 * 0x10;
    if (__position._M_current != local_68 + local_70) {
      peVar7 = ((__position._M_current)->
               super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      auVar22[0] = -(*(aux *)(peVar7->m_id).m_number._M_elems == *local_58);
      auVar22[1] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 1) == local_58[1]);
      auVar22[2] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 2) == local_58[2]);
      auVar22[3] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 3) == local_58[3]);
      auVar22[4] = -(*(aux *)((peVar7->m_id).m_number._M_elems + 1) == local_58[4]);
      auVar22[5] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 5) == local_58[5]);
      auVar22[6] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 6) == local_58[6]);
      auVar22[7] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 7) == local_58[7]);
      auVar22[8] = -(*(aux *)((peVar7->m_id).m_number._M_elems + 2) == local_58[8]);
      auVar22[9] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 9) == local_58[9]);
      auVar22[10] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 10) == local_58[10]);
      auVar22[0xb] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 0xb) == local_58[0xb]);
      auVar22[0xc] = -(*(aux *)((peVar7->m_id).m_number._M_elems + 3) == local_58[0xc]);
      auVar22[0xd] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 0xd) == local_58[0xd]);
      auVar22[0xe] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 0xe) == local_58[0xe]);
      auVar22[0xf] = -(*(aux *)((long)(peVar7->m_id).m_number._M_elems + 0xf) == local_58[0xf]);
      uVar2 = *(undefined4 *)(local_58 + 0x10);
      uVar14 = (peVar7->m_id).m_number._M_elems[4];
      auVar23[0] = -((char)uVar14 == (char)uVar2);
      auVar23[1] = -((char)(uVar14 >> 8) == (char)((uint)uVar2 >> 8));
      auVar23[2] = -((char)(uVar14 >> 0x10) == (char)((uint)uVar2 >> 0x10));
      auVar23[3] = -((char)(uVar14 >> 0x18) == (char)((uint)uVar2 >> 0x18));
      auVar23[4] = 0xff;
      auVar23[5] = 0xff;
      auVar23[6] = 0xff;
      auVar23[7] = 0xff;
      auVar23[8] = 0xff;
      auVar23[9] = 0xff;
      auVar23[10] = 0xff;
      auVar23[0xb] = 0xff;
      auVar23[0xc] = 0xff;
      auVar23[0xd] = 0xff;
      auVar23[0xe] = 0xff;
      auVar23[0xf] = 0xff;
      auVar23 = auVar23 & auVar22;
      this = local_a8;
      if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff) goto LAB_003d95c1;
    }
    psVar5 = local_a8->m_node->m_settings;
    prefix6 = (uint64_t)&psVar5->m_mutex;
    local_c0[0] = false;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&prefix6);
    local_c0[0] = true;
    _Var9 = (psVar5->m_store).m_bools.super__Base_bitset<2UL>._M_w[1];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&prefix6);
    this = local_a8;
    if ((flags.m_val & 2) == 0 && (char)_Var9 < '\0') {
      observer::target_addr
                (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if ((int)prefix6 == 1) {
        observer::target_addr
                  (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        boost::asio::ip::address::to_v6((address_v6 *)&prefix4,(address *)&prefix6);
        addr_bytes._M_elems[8] = uStack_88;
        addr_bytes._M_elems[9] = uStack_87;
        addr_bytes._M_elems[10] = uStack_86;
        addr_bytes._M_elems[0xb] = uStack_85;
        addr_bytes._M_elems[0xc] = uStack_84;
        addr_bytes._M_elems[0xd] = uStack_83;
        addr_bytes._M_elems[0xe] = uStack_82;
        addr_bytes._M_elems[0xf] = uStack_81;
        lVar15 = 0;
        uVar18 = 0;
        do {
          uVar18 = (ulong)addr_bytes._M_elems[lVar15] | uVar18 << 8;
          lVar15 = lVar15 + 1;
        } while ((int)lVar15 != 8);
        prefix6 = uVar18;
        pVar24 = ::std::
                 _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                 ::_M_insert_unique<unsigned_long_const&>
                           ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                             *)&this->m_peer6_prefixes,&prefix6);
        uVar21 = pVar24._8_8_;
      }
      else {
        observer::target_addr
                  (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        boost::asio::ip::address::to_v4((address *)&addr_bytes);
        prefix4 = (addr_bytes._M_elems._0_4_ & 0xff0000) >> 8 |
                  (addr_bytes._M_elems._0_4_ & 0xff00) << 8 | addr_bytes._M_elems._0_4_ << 0x18;
        pVar25 = ::std::
                 _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                 ::_M_insert_unique<unsigned_int_const&>
                           ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                             *)&this->m_peer4_prefixes,&prefix4);
        uVar21 = pVar25._8_8_;
      }
      if ((uVar21 & 1) == 0) {
        pdVar4 = this->m_node->m_observer;
        if ((pdVar4 != (dht_observer *)0x0) &&
           (iVar12 = (**(pdVar4->super_dht_logger)._vptr_dht_logger)(pdVar4,4), (char)iVar12 != '\0'
           )) {
          uVar14 = this->m_id;
          in_01.m_len = uVar18;
          in_01.m_ptr = (char *)0x14;
          aux::to_hex_abi_cxx11_
                    ((string *)&prefix6,
                     (aux *)&(o.
                              super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_id,in_01);
          uVar10 = prefix6;
          observer::target_addr
                    (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          aux::print_address_abi_cxx11_((string *)&prefix4,(aux *)&addr_bytes,addr_00);
          uVar8 = CONCAT44(uStack_8c,prefix4);
          iVar12 = (*this->_vptr_traversal_algorithm[2])(this);
          (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
                    (pdVar4,4,"[%u] traversal DUPLICATE node. id: %s addr: %s type: %s",
                     (ulong)uVar14,uVar10,uVar8,CONCAT44(extraout_var_01,iVar12));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_8c,prefix4) != &local_80) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_8c,prefix4),local_80._M_allocated_capacity + 1);
          }
          if ((undefined1 *)prefix6 != local_c0 + 8) {
            operator_delete((void *)prefix6,local_c0._8_8_ + 1);
          }
        }
        goto LAB_003d9641;
      }
    }
    pdVar4 = this->m_node->m_observer;
    if ((pdVar4 != (dht_observer *)0x0) &&
       (iVar12 = (**(pdVar4->super_dht_logger)._vptr_dht_logger)(pdVar4,4), (char)iVar12 != '\0')) {
      uVar3 = this->m_id;
      in_00.m_len = uVar18;
      in_00.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_((string *)&prefix6,this_01,in_00);
      local_68 = (pointer)CONCAT44(local_68._4_4_,uVar3);
      local_70 = prefix6;
      aux::print_endpoint_abi_cxx11_((string *)&prefix4,this_00,ep_00);
      uVar8 = CONCAT44(uStack_8c,prefix4);
      uVar14 = distance_exp((dht *)&this->m_target,(node_id *)this_01,n2_00);
      cVar19 = this->m_invoke_count;
      iVar12 = (*this->_vptr_traversal_algorithm[2])(this);
      (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
                (pdVar4,4,"[%u] ADD id: %s addr: %s distance: %d invoke-count: %d type: %s",
                 (ulong)local_68 & 0xffffffff,local_70,uVar8,(ulong)uVar14,(ulong)(uint)(int)cVar19,
                 CONCAT44(extraout_var_00,iVar12));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_8c,prefix4) != &local_80) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_8c,prefix4),local_80._M_allocated_capacity + 1);
      }
      if ((undefined1 *)prefix6 != local_c0 + 8) {
        operator_delete((void *)prefix6,local_c0._8_8_ + 1);
      }
    }
    ::std::
    vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
    ::insert(&this->m_results,__position,&o);
    this->m_sorted_results = this->m_sorted_results + '\x01';
  }
LAB_003d95c1:
  psVar16 = (this->m_results).
            super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (this->m_results).
           super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0x640 < (ulong)((long)psVar6 - (long)psVar16)) {
    psVar16 = psVar16 + 100;
    if (psVar16 != psVar6) {
      cVar19 = this->m_invoke_count;
      cVar20 = this->m_branch_factor;
      do {
        peVar7 = (psVar16->super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        bVar1 = (peVar7->flags).m_val;
        if ((bVar1 & 0x51) == 1) {
          (peVar7->flags).m_val = bVar1 | 0x80;
          cVar19 = cVar19 + -1;
          this->m_invoke_count = cVar19;
          if (((peVar7->flags).m_val & 8) != 0) {
            cVar20 = cVar20 + -1;
            this->m_branch_factor = cVar20;
          }
        }
        psVar16 = psVar16 + 1;
      } while (psVar16 != psVar6);
    }
    ::std::
    vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
    ::resize(&this->m_results,100);
    cVar19 = 'd';
    if (this->m_sorted_results < 'd') {
      cVar19 = this->m_sorted_results;
    }
    this->m_sorted_results = cVar19;
  }
LAB_003d9641:
  if (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void traversal_algorithm::add_entry(node_id const& id
	, udp::endpoint const& addr, observer_flags_t const flags)
{
	INVARIANT_CHECK;
	if (m_done) return;

	TORRENT_ASSERT(m_node.m_rpc.allocation_size() >= sizeof(find_data_observer));
	auto o = new_observer(addr, id);
	if (!o)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (get_node().observer() != nullptr)
		{
			get_node().observer()->log(dht_logger::traversal, "[%u] failed to allocate memory or observer. aborting!"
				, m_id);
		}
#endif
		done();
		return;
	}

	o->flags |= flags;

	if (id.is_all_zeros())
	{
		o->set_id(generate_random_id());
		o->flags |= observer::flag_no_id;

		m_results.push_back(o);

#ifndef TORRENT_DISABLE_LOGGING
		dht_observer* logger = get_node().observer();
		if (logger != nullptr && logger->should_log(dht_logger::traversal))
		{
			logger->log(dht_logger::traversal
				, "[%u] ADD (no-id) id: %s addr: %s distance: %d invoke-count: %d type: %s"
				, m_id, aux::to_hex(id).c_str(), aux::print_endpoint(addr).c_str()
				, distance_exp(m_target, id), m_invoke_count, name());
		}
#endif
	}
	else
	{
		TORRENT_ASSERT(std::size_t(m_sorted_results) <= m_results.size());
		auto end = m_results.begin() + m_sorted_results;

		TORRENT_ASSERT(libtorrent::dht::is_sorted(m_results.begin(), end
				, [this](observer_ptr const& lhs, observer_ptr const& rhs)
				{ return compare_ref(lhs->id(), rhs->id(), m_target); }));

		auto iter = std::lower_bound(m_results.begin(), end, o
			, [this](observer_ptr const& lhs, observer_ptr const& rhs)
			{ return compare_ref(lhs->id(), rhs->id(), m_target); });

		if (iter == end || (*iter)->id() != id)
		{
			// this IP restriction does not apply to the nodes we loaded from out
			// node cache
			if (m_node.settings().get_bool(settings_pack::dht_restrict_search_ips)
				&& !(flags & observer::flag_initial))
			{
				if (o->target_addr().is_v6())
				{
					address_v6::bytes_type addr_bytes = o->target_addr().to_v6().to_bytes();
					auto prefix_it = addr_bytes.cbegin();
					std::uint64_t const prefix6 = aux::read_uint64(prefix_it);

					if (m_peer6_prefixes.insert(prefix6).second)
						goto add_result;
				}
				else
				{
					// mask the lower octet
					std::uint32_t const prefix4
						= o->target_addr().to_v4().to_uint() & 0xffffff00;

					if (m_peer4_prefixes.insert(prefix4).second)
						goto add_result;
				}

				// we already have a node in this search with an IP very
				// close to this one. We know that it's not the same, because
				// it claims a different node-ID. Ignore this to avoid attacks
#ifndef TORRENT_DISABLE_LOGGING
				dht_observer* logger = get_node().observer();
				if (logger != nullptr && logger->should_log(dht_logger::traversal))
				{
					logger->log(dht_logger::traversal
						, "[%u] traversal DUPLICATE node. id: %s addr: %s type: %s"
						, m_id, aux::to_hex(o->id()).c_str(), aux::print_address(o->target_addr()).c_str(), name());
				}
#endif
				return;
			}

	add_result:

			TORRENT_ASSERT((o->flags & observer::flag_no_id)
				|| std::none_of(m_results.begin(), end
					, [&id](observer_ptr const& ob) { return ob->id() == id; }));

#ifndef TORRENT_DISABLE_LOGGING
			dht_observer* logger = get_node().observer();
			if (logger != nullptr && logger->should_log(dht_logger::traversal))
			{
				logger->log(dht_logger::traversal
					, "[%u] ADD id: %s addr: %s distance: %d invoke-count: %d type: %s"
					, m_id, aux::to_hex(id).c_str(), aux::print_endpoint(addr).c_str()
					, distance_exp(m_target, id), m_invoke_count, name());
			}
#endif
			m_results.insert(iter, o);
			++m_sorted_results;
		}
	}

	TORRENT_ASSERT(std::size_t(m_sorted_results) <= m_results.size());
	TORRENT_ASSERT(libtorrent::dht::is_sorted(m_results.begin()
		, m_results.begin() + m_sorted_results
		, [this](observer_ptr const& lhs, observer_ptr const& rhs)
		{ return compare_ref(lhs->id(), rhs->id(), m_target); }));

	if (m_results.size() > 100)
	{
		std::for_each(m_results.begin() + 100, m_results.end()
			, [this](std::shared_ptr<observer> const& ptr)
		{
			if ((ptr->flags & (observer::flag_queried | observer::flag_failed | observer::flag_alive))
				== observer::flag_queried)
			{
				// set the done flag on any outstanding queries to prevent them from
				// calling finished() or failed()
				ptr->flags |= observer::flag_done;
				TORRENT_ASSERT(m_invoke_count > 0);
				--m_invoke_count;

				if (ptr->flags & observer::flag_short_timeout)
				{
					TORRENT_ASSERT(m_branch_factor > 0);
					--m_branch_factor;
				}
			}

#if TORRENT_USE_ASSERTS
			ptr->m_was_abandoned = true;
#endif
		});
		m_results.resize(100);
		m_sorted_results = std::min(std::int8_t(100), m_sorted_results);
	}
}